

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall ValidationSignalsImpl::Clear(ValidationSignalsImpl *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  pointer pLVar4;
  list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_> *in_RDI;
  long in_FS_OFFSET;
  pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_> *entry;
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  *in_stack_ffffffffffffff98;
  size_t *in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_> *pszName
  ;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffd0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszName = in_RDI;
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(char *)pszName,
             in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x18,0));
  std::
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  ::begin((unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
           *)in_stack_ffffffffffffffa0);
  std::
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  ::end((unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
         *)in_stack_ffffffffffffffa0);
  while( true ) {
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
                        *)in_RDI,
                       (_Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
                        *)in_stack_ffffffffffffffa0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::__detail::
    _Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>
    ::operator*((_Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>
                 *)in_stack_ffffffffffffff98);
    pLVar4 = std::_List_iterator<ValidationSignalsImpl::ListEntry>::operator->
                       ((_List_iterator<ValidationSignalsImpl::ListEntry> *)
                        in_stack_ffffffffffffff98);
    iVar3 = pLVar4->count + -1;
    pLVar4->count = iVar3;
    if (iVar3 == 0) {
      in_stack_ffffffffffffffa0 =
           &in_RDI[1].
            super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
            ._M_impl._M_node._M_size;
      std::_List_const_iterator<ValidationSignalsImpl::ListEntry>::_List_const_iterator
                ((_List_const_iterator<ValidationSignalsImpl::ListEntry> *)in_stack_ffffffffffffff98
                 ,(iterator *)0x858140);
      in_stack_ffffffffffffffb0 =
           std::__cxx11::
           list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
           ::erase(in_RDI,in_stack_ffffffffffffffb0._M_node);
    }
    std::__detail::
    _Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>
                  *)in_stack_ffffffffffffff98);
  }
  std::
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  ::clear(in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Clear() EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        LOCK(m_mutex);
        for (const auto& entry : m_map) {
            if (!--entry.second->count) m_list.erase(entry.second);
        }
        m_map.clear();
    }